

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O0

int __thiscall Clasp::AcyclicityCheck::init(AcyclicityCheck *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint32 uVar2;
  ExtDepGraph *pEVar3;
  uint64 uVar4;
  uint64 in_stack_00000028;
  Constraint *in_stack_00000030;
  Solver *in_stack_00000038;
  ExtDepGraph *in_stack_00000040;
  SolverParams *in_stack_ffffffffffffffb8;
  AcyclicityCheck *in_stack_ffffffffffffffc0;
  PodQueue<Clasp::ExtDepGraph::Arc> *this_00;
  size_type in_stack_ffffffffffffffcc;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  Parent *in_stack_ffffffffffffffe0;
  AcyclicityCheck *this_01;
  
  this_01 = this;
  if (this->graph_ == (DependencyGraph *)0x0) {
    Solver::sharedContext((Solver *)ctx);
    pEVar3 = SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *)0x160a85);
    this->graph_ = pEVar3;
  }
  if (this->graph_ != (DependencyGraph *)0x0) {
    bVar1 = test_bit<unsigned_int>
                      ((uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (uint)in_stack_ffffffffffffffc0);
    if (bVar1) {
      Solver::sharedContext((Solver *)ctx);
      in_stack_ffffffffffffffd0 =
           (pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           SharedContext::configuration((SharedContext *)0x160ad1);
      uVar2 = Solver::id((Solver *)ctx);
      (**(_func_int **)((long)(in_stack_ffffffffffffffd0->ebo_).buf + 0x30))
                (in_stack_ffffffffffffffd0,(ulong)uVar2);
      setStrategy(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    ExtDepGraph::nodes(this->graph_);
    this->tagCnt_ = 0;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(uint *)in_stack_ffffffffffffffc0
              );
    this_00 = (PodQueue<Clasp::ExtDepGraph::Arc> *)&this->parent_;
    ExtDepGraph::nodes(this->graph_);
    memset(&stack0xffffffffffffffe0,0,8);
    Parent::Parent((Parent *)0x160b6a);
    bk_lib::
    pod_vector<Clasp::AcyclicityCheck::Parent,_std::allocator<Clasp::AcyclicityCheck::Parent>_>::
    resize((pod_vector<Clasp::AcyclicityCheck::Parent,_std::allocator<Clasp::AcyclicityCheck::Parent>_>
            *)this_01,(size_type)((ulong)ctx >> 0x20),in_stack_ffffffffffffffe0);
    PodQueue<Clasp::ExtDepGraph::Arc>::clear(this_00);
    this->solver_ = (Solver *)ctx;
    uVar4 = ExtDepGraph::attach(in_stack_00000040,in_stack_00000038,in_stack_00000030,
                                in_stack_00000028);
    this->genId_ = uVar4;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool AcyclicityCheck::init(Solver& s) {
	if (!graph_) { graph_ = s.sharedContext()->extGraph.get(); }
	if (!graph_) { return true; }
	if (test_bit(strat_, config_bit)) {
		setStrategy(s.sharedContext()->configuration()->solver(s.id()));
	}
	tags_.assign(graph_->nodes(), tagCnt_ = 0);
	parent_.resize(graph_->nodes());
	todo_.clear();
	solver_ = &s;
	genId_  = graph_->attach(s, *this, genId_);
	return true;
}